

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

EntryType * __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Js::WaiterList_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::AllocateEntries(BaseDictionary<unsigned_int,_Js::WaiterList_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *this,int size,bool zeroAllocate)

{
  bool bVar1;
  BOOL BVar2;
  HeapAllocator *pHVar3;
  undefined4 *puVar4;
  code *pcVar5;
  EntryType *pEVar6;
  long lVar7;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  local_50 = (undefined1  [8])&SimpleDictionaryEntry<unsigned_int,Js::WaiterList*>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_136c13;
  data.filename._0_4_ = 0x453;
  data.plusSize = (long)size;
  pHVar3 = Memory::HeapAllocator::TrackAllocInfo(this->alloc,(TrackAllocData *)local_50);
  lVar7 = -1;
  if (-1 < size) {
    lVar7 = (long)size << 4;
  }
  BVar2 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar2 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar1 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar1) goto LAB_00d5d80b;
    *puVar4 = 0;
  }
  if (zeroAllocate) {
    pcVar5 = Memory::HeapAllocator::AllocZero;
  }
  else {
    pcVar5 = Memory::HeapAllocator::Alloc;
  }
  pEVar6 = (EntryType *)(*pcVar5)(pHVar3,lVar7);
  if (pEVar6 == (EntryType *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar1 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar1) {
LAB_00d5d80b:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar4 = 0;
  }
  return pEVar6;
}

Assistant:

EntryType * AllocateEntries(DECLSPEC_GUARD_OVERFLOW int size, const bool zeroAllocate = true)
        {
            // Note that the choice of leaf/non-leaf node is decided for the EntryType on the basis of TValue. By default, if
            // TValue is a pointer, a non-leaf allocation is done. This behavior can be overridden by specializing
            // TypeAllocatorFunc for TValue.
            return
                AllocateArray<AllocatorType, EntryType, false>(
                    TRACK_ALLOC_INFO(alloc, EntryType, AllocatorType, 0, size),
                    zeroAllocate ? EntryAllocatorFuncType::GetAllocZeroFunc() : EntryAllocatorFuncType::GetAllocFunc(),
                    size);
        }